

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dxil_converter.cpp
# Opt level: O0

Id __thiscall
dxil_spv::Converter::Impl::fixup_store_type_atomic
          (Impl *this,ComponentType component_type,uint components,Id value)

{
  ComponentType input_type;
  undefined4 local_1c;
  ComponentType input_component_type;
  ComponentType output_component_type;
  Id value_local;
  uint components_local;
  ComponentType component_type_local;
  Impl *this_local;
  
  input_type = convert_component_to_unsigned(component_type);
  local_1c = value;
  if (component_type != input_type) {
    local_1c = build_value_cast(this,value,input_type,component_type,components);
  }
  return local_1c;
}

Assistant:

spv::Id Converter::Impl::fixup_store_type_atomic(DXIL::ComponentType component_type, unsigned components, spv::Id value)
{
	auto output_component_type = component_type;
	auto input_component_type = component_type;

	input_component_type = convert_component_to_unsigned(input_component_type);

	if (output_component_type != input_component_type)
		value = build_value_cast(value, input_component_type, output_component_type, components);
	return value;
}